

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall geometrycentral::surface::SurfaceMesh::compressFaces(SurfaceMesh *this)

{
  bool bVar1;
  reference pvVar2;
  SurfaceMesh *in_RDI;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *f_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *__range2_1;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *f;
  iterator __end2;
  iterator __begin2;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *__range2;
  bool isBL;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newBLIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  value_type_conflict *in_stack_fffffffffffffee8;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *this_00;
  SurfaceMesh *in_stack_fffffffffffffef0;
  allocator_type *in_stack_fffffffffffffef8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  _Self local_d0;
  _Self local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff48;
  _Self local_b0;
  _Self local_a8;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *local_a0;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  local_98;
  SurfaceMesh *local_80;
  byte local_71;
  ulong local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_20;
  
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x240669);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x240676);
  ::std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x240699);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
             (value_type_conflict *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ::std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2406c6);
  for (local_70 = 0; local_70 < in_RDI->nFacesCapacityCount; local_70 = local_70 + 1) {
    local_71 = in_RDI->nFacesCapacityCount - in_RDI->nBoundaryLoopsFillCount <= local_70;
    if (((local_70 < in_RDI->nFacesFillCount) || ((bool)local_71)) &&
       (in_stack_ffffffffffffff0f =
             faceIsDead(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8),
       !(bool)in_stack_ffffffffffffff0f)) {
      in_stack_ffffffffffffff00 = &local_20;
      in_stack_fffffffffffffef8 =
           (allocator_type *)
           ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     (in_stack_ffffffffffffff00);
      pvVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_50,local_70);
      *pvVar2 = (value_type)in_stack_fffffffffffffef8;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffff00,(value_type_conflict *)in_stack_fffffffffffffef8);
      if ((local_71 & 1) != 0) {
        in_stack_fffffffffffffef0 = (SurfaceMesh *)faceIndToBoundaryLoopInd(in_RDI,local_70);
        local_80 = in_stack_fffffffffffffef0;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      }
    }
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  this_00 = &local_98;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffff00,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffef8);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff00);
  updateValues(in_RDI,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff00);
  in_RDI->nFacesFillCount = in_RDI->nFacesCount;
  in_RDI->nFacesCapacityCount = in_RDI->nFacesCount + in_RDI->nBoundaryLoopsCount;
  in_RDI->nBoundaryLoopsFillCount = in_RDI->nBoundaryLoopsCount;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
             CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  local_a0 = &in_RDI->facePermuteCallbackList;
  local_a8._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
       ::begin(this_00);
  local_b0._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
       ::end(this_00);
  while (bVar1 = ::std::operator!=(&local_a8,&local_b0), bVar1) {
    ::std::
    _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
    ::operator*((_List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
                 *)0x24095c);
    ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
    operator()((function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
                *)in_stack_fffffffffffffef0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    ::std::
    _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
    ::operator++(&local_a8);
  }
  local_c8._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
       ::begin(this_00);
  local_d0._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
       ::end(this_00);
  while (bVar1 = ::std::operator!=(&local_c8,&local_d0), bVar1) {
    ::std::
    _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
    ::operator*((_List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
                 *)0x2409d0);
    ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
    operator()((function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
                *)in_stack_fffffffffffffef0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    ::std::
    _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
    ::operator++(&local_c8);
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff00);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff00);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void SurfaceMesh::compressFaces() {
  // Build the compressing shift
  std::vector<size_t> newIndMap;                                   // maps new ind -> old ind
  std::vector<size_t> newBLIndMap;                                 // maps BL new ind -> old ind
  std::vector<size_t> oldIndMap(nFacesCapacityCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nFacesCapacityCount; i++) {
    bool isBL = (i >= nFacesCapacityCount - nBoundaryLoopsFillCount);
    if (i < nFacesFillCount || isBL) { // skip gap between faces and BLs
      if (!faceIsDead(i)) {
        oldIndMap[i] = newIndMap.size();
        newIndMap.push_back(i);

        if (isBL) {
          newBLIndMap.push_back(faceIndToBoundaryLoopInd(i));
        }
      }
    }
  }


  // Permute & resize all per-face arrays
  fHalfedgeArr = applyPermutation(fHalfedgeArr, newIndMap);

  // Update indices in all face-valued arrays
  updateValues(heFaceArr, oldIndMap);

  // Update counts
  nFacesFillCount = nFacesCount;
  nFacesCapacityCount = nFacesCount + nBoundaryLoopsCount;
  nBoundaryLoopsFillCount = nBoundaryLoopsCount;

  // Invoke callbacks
  newIndMap.resize(nFacesCount); // truncate all boundary loop entries, so this array now just holds values for faces
  for (auto& f : facePermuteCallbackList) {
    f(newIndMap);
  }
  for (auto& f : boundaryLoopPermuteCallbackList) {
    f(newBLIndMap);
  }
}